

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool google::protobuf::anon_unknown_19::CheckParseInputSize
               (StringPiece input,ErrorCollector *error_collector)

{
  stringpiece_ssize_type sVar1;
  long *in_RDX;
  char *in_stack_fffffffffffffe48;
  AlphaNum *in_stack_fffffffffffffe50;
  AlphaNum local_160 [3];
  AlphaNum *in_stack_ffffffffffffff38;
  AlphaNum *in_stack_ffffffffffffff40;
  AlphaNum *in_stack_ffffffffffffff48;
  AlphaNum *in_stack_ffffffffffffff50;
  AlphaNum *in_stack_ffffffffffffff58;
  AlphaNum *in_stack_ffffffffffffff70;
  string local_40 [32];
  long *local_20;
  StringPiece local_18;
  
  local_20 = in_RDX;
  sVar1 = StringPiece::size(&local_18);
  if (sVar1 >= 0x80000000) {
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    StringPiece::size(&local_18);
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe50,(long)in_stack_fffffffffffffe48);
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    strings::AlphaNum::AlphaNum
              (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    strings::AlphaNum::AlphaNum(local_160,in_stack_fffffffffffffe48);
    StrCat_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                      in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff70)
    ;
    (**(code **)(*local_20 + 0x10))(local_20,0xffffffff,0,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return sVar1 < 0x80000000;
}

Assistant:

bool CheckParseInputSize(StringPiece input,
                         io::ErrorCollector* error_collector) {
  if (input.size() > INT_MAX) {
    error_collector->AddError(
        -1, 0,
        StrCat("Input size too large: ", static_cast<int64>(input.size()),
                     " bytes", " > ", INT_MAX, " bytes."));
    return false;
  }
  return true;
}